

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit-array.hpp
# Opt level: O2

underlying_type __thiscall baryonyx::bit_array_impl::block(bit_array_impl *this,int index)

{
  if ((-1 < index) && (index < this->m_block_size)) {
    return (this->m_data)._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[(uint)index];
  }
  details::fail_fast("Assertion","index >= 0 && index < m_block_size",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/bit-array.hpp"
                     ,"121");
}

Assistant:

underlying_type block(int index) const noexcept
    {
        bx_assert(index >= 0 && index < m_block_size);

        return m_data[index];
    }